

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::Descriptor::GetSourceLocation(Descriptor *this,SourceLocation *out_location)

{
  bool bVar1;
  vector<int,_std::allocator<int>_> path;
  vector<int,_std::allocator<int>_> local_28;
  
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  GetLocationPath(this,&local_28);
  bVar1 = FileDescriptor::GetSourceLocation
                    (*(FileDescriptor **)(this + 0x10),&local_28,out_location);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool Descriptor::GetSourceLocation(SourceLocation* out_location) const {
  vector<int> path;
  GetLocationPath(&path);
  return file()->GetSourceLocation(path, out_location);
}